

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_adae17::UsageRequirementProperty::Write<cmValue>
          (UsageRequirementProperty *this,cmTargetInternals *impl,optional<cmListFileBacktrace> *bt,
          string *prop,cmValue value,Action action)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  __n = prop->_M_string_length;
  if (__n == (this->Name).super_string_view._M_len) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp((prop->_M_dataplus)._M_p,(this->Name).super_string_view._M_str,__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (bVar2 != false) {
    WriteDirect<cmValue>(this,impl,bt,value,action);
  }
  return bVar2;
}

Assistant:

bool UsageRequirementProperty::Write(
  cmTargetInternals const* impl, cm::optional<cmListFileBacktrace> const& bt,
  const std::string& prop, ValueType value, Action action)
{
  if (prop == this->Name) {
    this->WriteDirect(impl, bt, value, action);
    return true;
  }
  return false;
}